

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O2

void __thiscall QGraphicsView::focusOutEvent(QGraphicsView *this,QFocusEvent *event)

{
  QPointer *this_00;
  long lVar1;
  long lVar2;
  bool bVar3;
  QObject *pQVar4;
  
  lVar1 = *(long *)(this + 8);
  QWidget::focusOutEvent((QWidget *)this,event);
  this_00 = (QPointer *)(lVar1 + 0x490);
  bVar3 = QPointer::operator_cast_to_bool(this_00);
  if (bVar3) {
    lVar2 = *(long *)this_00;
    if ((lVar2 == 0) || (*(int *)(lVar2 + 4) == 0)) {
      pQVar4 = (QObject *)0x0;
    }
    else {
      pQVar4 = *(QObject **)(lVar1 + 0x498);
    }
    QCoreApplication::sendEvent(pQVar4,(QEvent *)event);
    return;
  }
  return;
}

Assistant:

void QGraphicsView::focusOutEvent(QFocusEvent *event)
{
    Q_D(QGraphicsView);
    QAbstractScrollArea::focusOutEvent(event);
    if (d->scene)
        QCoreApplication::sendEvent(d->scene, event);
}